

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.h
# Opt level: O0

Node __thiscall trieste::Parse::parse_source(Parse *this,string *name,Token *token,Source *source)

{
  bool bVar1;
  __type_conflict1 _Var2;
  pointer ppVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  element_type *peVar4;
  runtime_error *prVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  __shared_ptr *in_R8;
  Node NVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  _Self local_168;
  _Base_ptr local_160;
  __shared_ptr_access<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_158
  ;
  shared_ptr<trieste::detail::RuleDef> *rule;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>
  *__range3;
  undefined1 local_130 [7];
  bool matched;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mode;
  allocator<char> local_f1;
  key_type local_f0;
  _Self local_d0;
  const_iterator find;
  Make make;
  Source *source_local;
  Token *token_local;
  string *name_local;
  Parse *this_local;
  
  make.re_iterator.sp.size_ = (size_type)in_R8;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_R8);
  if (bVar1) {
    detail::Make::Make((Make *)&find,(string *)token,(Token *)source,
                       (Source *)make.re_iterator.sp.size_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"start",&local_f1);
    local_d0._M_node =
         (_Base_ptr)
         CLI::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                 *)((long)&name[7].field_2 + 8),&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    mode.field_2._8_8_ =
         CLI::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                *)((long)&name[7].field_2 + 8));
    bVar1 = CLI::std::operator==(&local_d0,(_Self *)((long)&mode.field_2 + 8));
    if (bVar1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"unknown mode: start");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppVar3 = CLI::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>
             ::operator->(&local_d0);
    __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &make.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar3);
    std::__cxx11::string::string((string *)local_130,__str);
    while (bVar1 = REIterator::empty((REIterator *)&make.re_match.matches),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __range3._7_1_ = false;
      ppVar3 = CLI::std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>
               ::operator->(&local_d0);
      __end3 = CLI::std::
               vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>
               ::begin(&ppVar3->second);
      rule = (shared_ptr<trieste::detail::RuleDef> *)
             CLI::std::
             vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>
             ::end(&ppVar3->second);
      while (bVar1 = __gnu_cxx::
                     operator==<const_std::shared_ptr<trieste::detail::RuleDef>_*,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>
                               (&__end3,(__normal_iterator<const_std::shared_ptr<trieste::detail::RuleDef>_*,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>
                                         *)&rule), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_158 = (__shared_ptr_access<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)__gnu_cxx::
                       __normal_iterator<const_std::shared_ptr<trieste::detail::RuleDef>_*,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>
                       ::operator*(&__end3);
        peVar4 = CLI::std::
                 __shared_ptr_access<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_158);
        __range3._7_1_ =
             REIterator::consume((REIterator *)&make.re_match.matches,&peVar4->regex,
                                 (REMatch *)((long)&make.mode_.field_2 + 8));
        if (__range3._7_1_) {
          peVar4 = CLI::std::
                   __shared_ptr_access<trieste::detail::RuleDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_158);
          CLI::std::function<void_(trieste::detail::Make_&)>::operator()
                    (&peVar4->effect,(Make *)&find);
          _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&make.node.
                                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_130);
          if (((_Var2 ^ 0xffU) & 1) != 0) {
            local_160 = (_Base_ptr)
                        CLI::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                        ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                                *)((long)&name[7].field_2 + 8),
                               (key_type *)
                               &make.node.
                                super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
            local_d0._M_node = local_160;
            local_168._M_node =
                 (_Base_ptr)
                 CLI::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>_>
                        *)((long)&name[7].field_2 + 8));
            bVar1 = CLI::std::operator==(&local_d0,&local_168);
            if (bVar1) {
              prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_188,"unknown mode: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &make.node.
                              super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
              std::runtime_error::runtime_error(prVar5,(string *)&local_188);
              __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            ppVar3 = CLI::std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>_>
                     ::operator->(&local_d0);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130
                      ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar3);
          }
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<trieste::detail::RuleDef>_*,_std::vector<std::shared_ptr<trieste::detail::RuleDef>,_std::allocator<std::shared_ptr<trieste::detail::RuleDef>_>_>_>
        ::operator++(&__end3);
      }
      if (__range3._7_1_ == false) {
        detail::Make::invalid((Make *)&find);
        REIterator::skip((REIterator *)&make.re_match.matches,1);
      }
    }
    bVar1 = std::function::operator_cast_to_bool((function *)(name[6].field_2._M_local_buf + 8));
    if (bVar1) {
      CLI::std::function<void_(trieste::detail::Make_&)>::operator()
                ((function<void_(trieste::detail::Make_&)> *)((long)&name[6].field_2 + 8),
                 (Make *)&find);
    }
    detail::Make::done((Make *)this);
    std::__cxx11::string::~string((string *)local_130);
    detail::Make::~Make((Make *)&find);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<trieste::NodeDef>::shared_ptr((shared_ptr<trieste::NodeDef> *)this);
    _Var6._M_pi = extraout_RDX;
  }
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Node)NVar7.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node parse_source(
      const std::string name, const Token& token, const Source& source) const
    {
      if (!source)
        return {};

      auto make = detail::Make(name, token, source);

      // Find the start rules.
      auto find = rules.find("start");
      if (find == rules.end())
        throw std::runtime_error("unknown mode: start");

      auto mode = make.mode_ = find->first;

      while (!make.re_iterator.empty())
      {
        bool matched = false;

        for (auto& rule : find->second)
        {
          matched = make.re_iterator.consume(rule->regex, make.re_match);

          if (matched)
          {
            rule->effect(make);

            if (make.mode_ != mode)
            {
              find = rules.find(make.mode_);
              if (find == rules.end())
                throw std::runtime_error("unknown mode: " + make.mode_);

              mode = find->first;
            }
            break;
          }
        }

        if (!matched)
        {
          make.invalid();
          make.re_iterator.skip();
        }
      }

      if (done_)
        done_(make);

      return make.done();
    }